

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2003e3::HandleHasParentPathCommand::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,cmCMakePath *path)

{
  bool bVar1;
  cmCMakePath *path_local;
  anon_class_1_0_00000001 *this_local;
  
  bVar1 = cmCMakePath::HasParentPath(path);
  return bVar1;
}

Assistant:

bool HandleIsAbsoluteCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("IS_ABSOLUTE must be called with two arguments.");
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  if (args[2].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  bool isAbsolute = cmCMakePath(inputPath).IsAbsolute();

  status.GetMakefile().AddDefinitionBool(args[2], isAbsolute);

  return true;
}